

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axis_property.c
# Opt level: O0

int mpt_axis_get(mpt_axis *ax,mpt_property *pr)

{
  int iVar1;
  bool bVar2;
  char *local_78;
  char *elem_name [10];
  int pos;
  mpt_property *pr_local;
  mpt_axis *ax_local;
  
  if (pr == (mpt_property *)0x0) {
    iVar1 = mpt_axis_pointer_typeid();
    return iVar1;
  }
  if (pr->name == (char *)0x0) {
    elem_name[9]._4_4_ = (int)pr->desc;
    if ((elem_name[9]._4_4_ < 0) || (9 < elem_name[9]._4_4_)) {
      return -1;
    }
  }
  else {
    if (*pr->name == '\0') {
      pr->name = "axis";
      pr->desc = "mpt axis data";
      (pr->val)._addr = "sddfnyyyycc";
      (pr->val)._type = 0;
      bVar2 = false;
      if (ax != (mpt_axis *)0x0) {
        iVar1 = memcmp(ax,&def_axis,0x28);
        bVar2 = iVar1 != 0;
      }
      return (uint)bVar2;
    }
    for (elem_name[9]._4_4_ = 0; elem_name[9]._4_4_ < 10;
        elem_name[9]._4_4_ = elem_name[9]._4_4_ + 1) {
      elem_name[(long)elem_name[9]._4_4_ + -1] = mpt_axis_get::elem[elem_name[9]._4_4_].name;
    }
    elem_name[9]._4_4_ = mpt_property_match(pr->name,3,&local_78,(long)elem_name[9]._4_4_);
    if (elem_name[9]._4_4_ < 0) {
      return -1;
    }
  }
  pr->name = mpt_axis_get::elem[elem_name[9]._4_4_].name;
  pr->desc = mpt_axis_get::elem[elem_name[9]._4_4_].desc;
  if (ax == (mpt_axis *)0x0) {
    (pr->val)._addr = (void *)mpt_axis_get::elem[elem_name[9]._4_4_].off;
    (pr->val)._type = (long)mpt_axis_get::elem[elem_name[9]._4_4_].type;
    ax_local._4_4_ = elem_name[9]._4_4_;
  }
  else {
    if ((elem_name[9]._4_4_ == 5) && ((ax->format & 0x20) != 0)) {
      (pr->val)._type = 0x73;
      *(char **)pr->_buf = "log";
      (pr->val)._addr = pr->_buf;
    }
    else {
      (pr->val)._addr = (void *)((long)&ax->_title + mpt_axis_get::elem[elem_name[9]._4_4_].off);
      (pr->val)._type = (long)mpt_axis_get::elem[elem_name[9]._4_4_].type;
    }
    ax_local._4_4_ =
         mpt_value_compare(&pr->val,(long)&def_axis._title +
                                    mpt_axis_get::elem[elem_name[9]._4_4_].off);
  }
  return ax_local._4_4_;
}

Assistant:

extern int mpt_axis_get(const MPT_STRUCT(axis) *ax, MPT_STRUCT(property) *pr)
{
	static const struct {
		const char  *name;
		const char  *desc;
		const int    type;
		const size_t off;
	} elem[] = {
		{"title",     "axis title",              's',  MPT_offset(axis, _title) },
		{"begin",     "axis start value",        'd',  MPT_offset(axis, begin) },
		{"end",       "axis end value",          'd',  MPT_offset(axis, end) },
		{"tlen",      "relative tick length ",   'f',  MPT_offset(axis, tlen) },
		{"exponent",  "label exponent",          'n',  MPT_offset(axis, exp) },
		{"intervals", "intervals between ticks", 'y',  MPT_offset(axis, intv) },
		{"subtick",   "intermediate ticks",      'y',  MPT_offset(axis, sub) },
		{"decimals",  "decimal places",          'y',  MPT_offset(axis, dec) },
		{"lpos",      "label direction",         'c',  MPT_offset(axis, lpos) },
		{"tpos",      "title direction",         'c',  MPT_offset(axis, tpos) },
	};
	
	static const uint8_t format[] = {
		's',
		'd', 'd', /* axis range values */
		'f',      /* relative tick length */
		'n',      /* scale value */
		'y', 'y', /* intervals, subintervals */
		'y',      /* axis flags */
		'y',      /* decimals */
		'c', 'c', /* label/title direction */
		0
	};
	int pos;
	
	if (!pr) {
		return mpt_axis_pointer_typeid();
	}
	/* property by position */
	if (!pr->name) {
		pos = (intptr_t) pr->desc;
		if (pos < 0 || pos >= (int) MPT_arrsize(elem)) {
			return MPT_ERROR(BadArgument);
		}
	}
	/* get total type */
	else if (!*pr->name) {
		pr->name = "axis";
		pr->desc = "mpt axis data";
		MPT_value_set(&pr->val, 0, format);
		
		return ax && memcmp(ax, &def_axis, sizeof(*ax)) ? 1 : 0;
	}
	/* find property by name */
	else {
		const char *elem_name[MPT_arrsize(elem)];
		for (pos = 0; pos < (int) MPT_arrsize(elem); pos++) {
			elem_name[pos] = elem[pos].name;
		}
		if ((pos = mpt_property_match(pr->name, 3, elem_name, pos)) < 0) {
			return MPT_ERROR(BadArgument);
		}
	}
	pr->name = elem[pos].name;
	pr->desc = elem[pos].desc;
	
	if (!ax) {
		MPT_value_set(&pr->val, elem[pos].type, ((uint8_t *) ax) + elem[pos].off);
		return pos;
	}
	
	if ((pos == 5) && (ax->format & MPT_ENUM(TransformLg))) {
		static const char desc[] = "log\0";
		MPT_property_set_string(pr, desc);
	} else {
		MPT_value_set(&pr->val, elem[pos].type, ((uint8_t *) ax) + elem[pos].off);
	}
	return mpt_value_compare(&pr->val, ((uint8_t *) &def_axis) + elem[pos].off);
}